

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_globaltype_t * wasm_global_type(wasm_global_t *global)

{
  ExternKind EVar1;
  Object *pOVar2;
  undefined8 uVar3;
  wasm_globaltype_t *pwVar4;
  ExternType *pEVar5;
  
  pwVar4 = (wasm_globaltype_t *)operator_new(0x18);
  pOVar2 = (global->super_wasm_extern_t).super_wasm_ref_t.I.obj_;
  if (pOVar2->kind_ == Global) {
    EVar1 = pOVar2[1].kind_;
    uVar3 = *(undefined8 *)&pOVar2[1].field_0xc;
    pEVar5 = (ExternType *)operator_new(0x18);
    pEVar5->kind = EVar1;
    pEVar5->_vptr_ExternType = (_func_int **)&PTR__ExternType_001ea970;
    *(undefined8 *)&pEVar5->field_0xc = uVar3;
    (pwVar4->super_wasm_externtype_t).I._M_t.
    super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
    _M_t.
    super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
    .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl = pEVar5;
    (pwVar4->super_wasm_externtype_t)._vptr_wasm_externtype_t =
         (_func_int **)&PTR__wasm_externtype_t_001eac50;
    (pwVar4->valtype).I.enum_ = (Enum)uVar3;
    return pwVar4;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::Global, Base = wabt::interp::Object]"
               );
}

Assistant:

own wasm_globaltype_t* wasm_global_type(const wasm_global_t* global) {
  return new wasm_globaltype_t{global->As<Global>()->type()};
}